

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall
Matrix::CopyRow(Matrix *this,Matrix *source_matrix,int source_row,int destination_row)

{
  long lVar1;
  bool bVar2;
  Fraction *pFVar3;
  long lVar4;
  int j;
  long lVar5;
  bool local_40;
  
  j = 0;
  if (this->m_ < 1) {
    local_40 = false;
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    local_40 = false;
    do {
      lVar1 = *(long *)&(this->elements_).
                        super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[destination_row].
                        super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                        super__Vector_impl_data;
      pFVar3 = At(source_matrix,source_row,j);
      bVar2 = operator!=((Fraction *)(lVar1 + lVar4),pFVar3);
      if (bVar2) {
        pFVar3 = At(source_matrix,source_row,j);
        *(Fraction *)
         (*(long *)&(this->elements_).
                    super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[destination_row].
                    super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                    super__Vector_impl_data + lVar4) = *pFVar3;
        local_40 = true;
      }
      lVar5 = lVar5 + 1;
      j = j + 1;
      lVar4 = lVar4 + 8;
    } while (lVar5 < this->m_);
  }
  return local_40;
}

Assistant:

bool Matrix::CopyRow(const Matrix& source_matrix, int source_row, int destination_row) {
  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[destination_row][column] != source_matrix.At(source_row, column)) {
      result = true;
      elements_[destination_row][column] = source_matrix.At(source_row, column);
    }
  }

  return result;
}